

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_123::PromisedAsyncOutputStream::write
          (PromisedAsyncOutputStream *this,int __fd,void *__buf,size_t __n)

{
  PromiseArena *pPVar1;
  undefined8 uVar2;
  void *pvVar3;
  undefined4 in_register_00000034;
  PromiseArena *pPVar4;
  undefined1 local_68 [24];
  EventLoop *local_50;
  undefined1 local_48 [24];
  
  pPVar4 = (PromiseArena *)CONCAT44(in_register_00000034,__fd);
  if (*(long *)(pPVar4->bytes + 0x20) == 0) {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_68);
    uVar2 = local_68._0_8_;
    pPVar1 = ((PromiseArenaMember *)local_68._0_8_)->arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_68._0_8_ - (long)pPVar1) < 0x38) {
      pvVar3 = operator_new(0x400);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)((long)pvVar3 + 0x3c8),(OwnPromiseNode *)local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2521:39)>
                 ::anon_class_24_2_4df0a340_for_func::operator());
      *(undefined ***)((long)pvVar3 + 0x3c8) = &PTR_destroy_00648508;
      *(PromiseArena **)((long)pvVar3 + 1000) = pPVar4;
      *(void **)((long)pvVar3 + 0x3f0) = __buf;
      *(size_t *)((long)pvVar3 + 0x3f8) = __n;
      *(void **)((long)pvVar3 + 0x3d0) = pvVar3;
      local_68._16_8_ = (TransformPromiseNodeBase *)((long)pvVar3 + 0x3c8);
    }
    else {
      ((PromiseArenaMember *)local_68._0_8_)->arena = (PromiseArena *)0x0;
      local_68._8_8_ = &((PromiseArenaMember *)(local_68._0_8_ + -0x40))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                ((TransformPromiseNodeBase *)local_68._8_8_,(OwnPromiseNode *)local_68,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:2521:39)>
                 ::anon_class_24_2_4df0a340_for_func::operator());
      ((PromiseArenaMember *)(uVar2 + -0x40))->arena = (PromiseArena *)&PTR_destroy_00648508;
      ((PromiseArenaMember *)(uVar2 + -0x20))->arena = pPVar4;
      ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = (_func_int **)__buf;
      ((PromiseArenaMember *)(uVar2 + -0x10))->arena = (PromiseArena *)__n;
      ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
      local_68._16_8_ = local_68._8_8_;
    }
    local_48._0_8_ = &DAT_004a8171;
    local_48._8_8_ = &DAT_004a81d0;
    local_48._16_8_ = &DAT_4c0000058b;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_50,(OwnPromiseNode *)(local_68 + 0x10),
               (SourceLocation *)local_48);
    uVar2 = local_68._16_8_;
    (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = (_func_int **)local_50;
    if ((TransformPromiseNodeBase *)local_68._16_8_ != (TransformPromiseNodeBase *)0x0) {
      local_68._16_8_ = (TransformPromiseNodeBase *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
    uVar2 = local_68._0_8_;
    if ((PromiseArenaMember *)local_68._0_8_ != (PromiseArenaMember *)0x0) {
      local_68._0_8_ = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
    }
  }
  else {
    (**(code **)(**(long **)(pPVar4->bytes + 0x20) + 8))
              (this,*(long **)(pPVar4->bytes + 0x20),__buf,__n);
  }
  return (ssize_t)this;
}

Assistant:

KJ_IF_SOME(s, stream) {
      return s->write(pieces);
    }